

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

state * getstate(lemon *lemp)

{
  int iVar1;
  config *pcVar2;
  config *local_38;
  config *y;
  config *x;
  state *stp;
  config *bp;
  config *cfp;
  lemon *lemp_local;
  
  Configlist_sortbasis();
  y = Configlist_basis();
  x = (config *)State_find(y);
  if ((state *)x == (state *)0x0) {
    Configlist_closure(lemp);
    Configlist_sort();
    pcVar2 = Configlist_return();
    x = (config *)State_new();
    if ((state *)x == (state *)0x0) {
      memory_error();
    }
    ((state *)x)->bp = y;
    ((state *)x)->cfp = pcVar2;
    iVar1 = lemp->nstate;
    lemp->nstate = iVar1 + 1;
    ((state *)x)->statenum = iVar1;
    ((state *)x)->ap = (action *)0x0;
    State_insert((state *)x,((state *)x)->bp);
    buildshifts(lemp,(state *)x);
  }
  else {
    local_38 = ((state *)x)->bp;
    for (; y != (config *)0x0 && local_38 != (config *)0x0; y = y->bp) {
      Plink_copy(&local_38->bplp,y->bplp);
      Plink_delete(y->fplp);
      y->bplp = (plink *)0x0;
      y->fplp = (plink *)0x0;
      local_38 = local_38->bp;
    }
    pcVar2 = Configlist_return();
    Configlist_eat(pcVar2);
  }
  return (state *)x;
}

Assistant:

state *getstate(struct lemon *lemp)
{
  struct config *cfp, *bp;
  struct state *stp;

  /* Extract the sorted basis of the new state.  The basis was constructed
  ** by prior calls to "Configlist_addbasis()". */
  Configlist_sortbasis();
  bp = Configlist_basis();

  /* Get a state with the same basis */
  stp = State_find(bp);
  if( stp ){
    /* A state with the same basis already exists!  Copy all the follow-set
    ** propagation links from the state under construction into the
    ** preexisting state, then return a pointer to the preexisting state */
    struct config *x, *y;
    for(x=bp, y=stp->bp; x && y; x=x->bp, y=y->bp){
      Plink_copy(&y->bplp,x->bplp);
      Plink_delete(x->fplp);
      x->fplp = x->bplp = 0;
    }
    cfp = Configlist_return();
    Configlist_eat(cfp);
  }else{
    /* This really is a new state.  Construct all the details */
    Configlist_closure(lemp);    /* Compute the configuration closure */
    Configlist_sort();           /* Sort the configuration closure */
    cfp = Configlist_return();   /* Get a pointer to the config list */
    stp = State_new();           /* A new state structure */
    MemoryCheck(stp);
    stp->bp = bp;                /* Remember the configuration basis */
    stp->cfp = cfp;              /* Remember the configuration closure */
    stp->statenum = lemp->nstate++; /* Every state gets a sequence number */
    stp->ap = 0;                 /* No actions, yet. */
    State_insert(stp,stp->bp);   /* Add to the state table */
    buildshifts(lemp,stp);       /* Recursively compute successor states */
  }
  return stp;
}